

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_dead_builtin_varyings.cpp
# Opt level: O3

ir_visitor_status __thiscall
anon_unknown.dwarf_1907e5::replace_varyings_visitor::visit_leave
          (replace_varyings_visitor *this,ir_assignment *ir)

{
  ir_rvalue *lhs;
  ir_rvalue *local_20;
  
  (*(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    _vptr_ir_hierarchical_visitor[0x28])(this,&ir->rhs);
  (*(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    _vptr_ir_hierarchical_visitor[0x28])(this,&ir->condition);
  local_20 = &ir->lhs->super_ir_rvalue;
  (*(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    _vptr_ir_hierarchical_visitor[0x28])(this,&local_20);
  if (local_20 != &ir->lhs->super_ir_rvalue) {
    ir_assignment::set_lhs(ir,local_20);
  }
  return visit_continue;
}

Assistant:

virtual ir_visitor_status visit_leave(ir_assignment *ir)
   {
      handle_rvalue(&ir->rhs);
      handle_rvalue(&ir->condition);

      /* We have to use set_lhs when changing the LHS of an assignment. */
      ir_rvalue *lhs = ir->lhs;

      handle_rvalue(&lhs);
      if (lhs != ir->lhs) {
         ir->set_lhs(lhs);
      }

      return visit_continue;
   }